

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall cmComputeLinkDepends::VisitEntry(cmComputeLinkDepends *this,int index)

{
  _Base_ptr *this_00;
  _Rb_tree_header *p_Var1;
  uint component;
  int iVar2;
  iterator __position;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  int *piVar6;
  cmComputeComponentGraph *pcVar7;
  PendingComponent *pPVar8;
  _Base_ptr p_Var9;
  int *piVar10;
  cmGraphEdge *oi;
  pointer pcVar11;
  const_iterator __position_00;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar12;
  _Alloc_node __an;
  int local_34;
  _Alloc_node local_30;
  
  __position._M_current =
       (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_34 = index;
  if (__position._M_current ==
      (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->FinalLinkOrder,__position,&local_34);
  }
  else {
    *__position._M_current = index;
    (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  p_Var9 = (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pcVar7 = this->CCG;
  component = (pcVar7->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_34];
  if (p_Var9 != (_Base_ptr)0x0) {
    p_Var1 = &(this->PendingComponents)._M_t._M_impl.super__Rb_tree_header;
    iVar2 = (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)component];
    __position_00._M_node = &p_Var1->_M_header;
    do {
      if (iVar2 <= (int)p_Var9[1]._M_color) {
        __position_00._M_node = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < iVar2];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position_00._M_node != p_Var1) &&
       ((int)__position_00._M_node[1]._M_color <= iVar2)) {
      this_00 = &__position_00._M_node[1]._M_left;
      pVar12 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            *)this_00,&local_34);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   this_00,(_Base_ptr)pVar12.first._M_node,(_Base_ptr)pVar12.second._M_node);
      if (__position_00._M_node[2]._M_right != (_Base_ptr)0x0) {
        return;
      }
      piVar10 = (int *)((long)&__position_00._M_node[1]._M_parent + 4);
      *piVar10 = *piVar10 + -1;
      if (*piVar10 != 0) {
        pcVar3 = (this->CCG->Components).
                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = *(int **)&pcVar3[(int)component].super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl;
        piVar6 = *(pointer *)
                  ((long)&pcVar3[(int)component].super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
        if ((ulong)((long)piVar6 - (long)piVar10) < 5) {
          __assert_fail("nl.size() > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmComputeLinkDepends.cxx"
                        ,0x2e6,"void cmComputeLinkDepends::VisitEntry(int)");
        }
        if (piVar10 == piVar6) {
          return;
        }
        local_30._M_t =
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             this_00;
        do {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     this_00,(const_iterator)&__position_00._M_node[1]._M_right,piVar10,&local_30);
          piVar10 = piVar10 + 1;
        } while (piVar10 != piVar6);
        return;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::PendingComponent>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
      ::_M_erase_aux(&(this->PendingComponents)._M_t,__position_00);
      pcVar7 = this->CCG;
      goto LAB_003fb29c;
    }
  }
  pcVar3 = (pcVar7->Components).
           super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (4 < (ulong)((long)*(pointer *)
                         ((long)&pcVar3[(int)component].super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                 *(long *)&pcVar3[(int)component].super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl)) {
    pPVar8 = MakePendingComponent(this,component);
    pVar12 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
             equal_range(&(pPVar8->Entries)._M_t,&local_34);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              (&(pPVar8->Entries)._M_t,(_Base_ptr)pVar12.first._M_node,
               (_Base_ptr)pVar12.second._M_node);
    return;
  }
LAB_003fb29c:
  pcVar4 = (pcVar7->ComponentGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = *(pointer *)
            ((long)&pcVar4[(int)component].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
  for (pcVar11 = *(pointer *)
                  &pcVar4[(int)component].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                   super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>; pcVar11 != pcVar5;
      pcVar11 = pcVar11 + 1) {
    MakePendingComponent(this,pcVar11->Dest);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::VisitEntry(int index)
{
  // Include this entry on the link line.
  this->FinalLinkOrder.push_back(index);

  // This entry has now been seen.  Update its component.
  bool completed = false;
  int component = this->CCG->GetComponentMap()[index];
  std::map<int, PendingComponent>::iterator mi =
    this->PendingComponents.find(this->ComponentOrder[component]);
  if (mi != this->PendingComponents.end()) {
    // The entry is in an already pending component.
    PendingComponent& pc = mi->second;

    // Remove the entry from those pending in its component.
    pc.Entries.erase(index);
    if (pc.Entries.empty()) {
      // The complete component has been seen since it was last needed.
      --pc.Count;

      if (pc.Count == 0) {
        // The component has been completed.
        this->PendingComponents.erase(mi);
        completed = true;
      } else {
        // The whole component needs to be seen again.
        NodeList const& nl = this->CCG->GetComponent(component);
        assert(nl.size() > 1);
        pc.Entries.insert(nl.begin(), nl.end());
      }
    }
  } else {
    // The entry is not in an already pending component.
    NodeList const& nl = this->CCG->GetComponent(component);
    if (nl.size() > 1) {
      // This is a non-trivial component.  It is now pending.
      PendingComponent& pc = this->MakePendingComponent(component);

      // The starting entry has already been seen.
      pc.Entries.erase(index);
    } else {
      // This is a trivial component, so it is already complete.
      completed = true;
    }
  }

  // If the entry completed a component, the component's dependencies
  // are now pending.
  if (completed) {
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(component);
    for (cmGraphEdge const& oi : ol) {
      // This entire component is now pending no matter whether it has
      // been partially seen already.
      this->MakePendingComponent(oi);
    }
  }
}